

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyString.cpp
# Opt level: O2

PropertyString *
Js::PropertyString::New(StaticType *type,PropertyRecord *propertyRecord,Recycler *recycler)

{
  Recycler *alloc;
  PropertyString *this;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  local_48 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_88d558e;
  data.filename._0_4_ = 0x14;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_48);
  this = (PropertyString *)new<Memory::Recycler>(0x40,alloc,0x51e21e);
  PropertyString(this,type,propertyRecord);
  return this;
}

Assistant:

PropertyString* PropertyString::New(StaticType* type, const Js::PropertyRecord* propertyRecord, Recycler *recycler)
    {
        return RecyclerNewZ(recycler, PropertyString, type, propertyRecord);
    }